

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O3

_Bool COSE_Recipient_SetSenderKey
                (HCOSE_RECIPIENT h,cn_cbor *pKey,int destination,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  cn_cbor *pcVar3;
  cn_cbor *pcVar4;
  int key;
  cn_cbor_errback cbor_err;
  cn_cbor_errback local_38;
  
  if ((h == (HCOSE_RECIPIENT)0x0) ||
     (local_38 = in_RAX, _Var1 = _COSE_IsInList(RecipientRoot,(COSE *)h), !_Var1)) {
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    perr->err = COSE_ERR_INVALID_HANDLE;
    return false;
  }
  if (pKey == (cn_cbor *)0x0) {
LAB_00198a28:
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    perr->err = COSE_ERR_INVALID_PARAMETER;
    return false;
  }
  if (destination == 0) goto LAB_00198a05;
  if (destination != 2) {
    if ((destination != 1) || (pcVar3 = cn_cbor_mapget_int(pKey,2), pcVar3 == (cn_cbor *)0x0))
    goto LAB_00198a28;
    pcVar3 = cn_cbor_clone(pcVar3,&local_38);
    if (pcVar3 == (cn_cbor *)0x0) goto LAB_00198b5d;
    key = -3;
LAB_001989ed:
    _Var1 = _COSE_map_put((COSE *)h,key,pcVar3,2,perr);
    if (_Var1) {
LAB_00198a05:
      *(cn_cbor **)(h + 0x80) = pKey;
      return true;
    }
    goto LAB_00198ba8;
  }
  pcVar3 = cn_cbor_map_create(&local_38);
  if (pcVar3 == (cn_cbor *)0x0) {
LAB_00198b5d:
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    cVar2 = _MapFromCBOR(local_38);
    perr->err = cVar2;
    return false;
  }
  cVar2 = COSE_ERR_INVALID_PARAMETER;
  pcVar4 = cn_cbor_mapget_int(pKey,1);
  if (pcVar4 == (cn_cbor *)0x0) {
    if (perr == (cose_errback *)0x0) goto LAB_00198ba8;
  }
  else {
    pcVar4 = cn_cbor_clone(pcVar4,&local_38);
    if (pcVar4 != (cn_cbor *)0x0) {
      _Var1 = cn_cbor_mapput_int(pcVar3,1,pcVar4,&local_38);
      if (_Var1) {
        pcVar4 = cn_cbor_mapget_int(pKey,-1);
        pcVar4 = cn_cbor_clone(pcVar4,&local_38);
        if (pcVar4 == (cn_cbor *)0x0) goto LAB_00198b76;
        _Var1 = cn_cbor_mapput_int(pcVar3,-1,pcVar4,&local_38);
        if (_Var1) {
          pcVar4 = cn_cbor_mapget_int(pKey,-2);
          pcVar4 = cn_cbor_clone(pcVar4,&local_38);
          if (pcVar4 == (cn_cbor *)0x0) goto LAB_00198b76;
          _Var1 = cn_cbor_mapput_int(pcVar3,-2,pcVar4,&local_38);
          if (_Var1) {
            pcVar4 = cn_cbor_mapget_int(pKey,-3);
            pcVar4 = cn_cbor_clone(pcVar4,&local_38);
            if (pcVar4 == (cn_cbor *)0x0) goto LAB_00198b76;
            _Var1 = cn_cbor_mapput_int(pcVar3,-3,pcVar4,&local_38);
            if (_Var1) {
              key = -2;
              goto LAB_001989ed;
            }
          }
        }
      }
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_38);
        perr->err = cVar2;
      }
      cn_cbor_free(pcVar3);
      pcVar3 = pcVar4;
      goto LAB_00198ba8;
    }
LAB_00198b76:
    if (perr == (cose_errback *)0x0) goto LAB_00198ba8;
    cVar2 = _MapFromCBOR(local_38);
  }
  perr->err = cVar2;
LAB_00198ba8:
  cn_cbor_free(pcVar3);
  return false;
}

Assistant:

bool COSE_Recipient_SetSenderKey(HCOSE_RECIPIENT h, const cn_cbor * pKey, int destination, cose_errback * perr)
{
	COSE_RecipientInfo * p;
	bool f = false;
	cn_cbor * cn;
	cn_cbor * cn2 = NULL;
	cn_cbor * cn3 = NULL;
	cn_cbor_errback cbor_err;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif

	CHECK_CONDITION(IsValidRecipientHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)h;

#ifdef USE_CBOR_CONTEXT
	context = &p->m_encrypt.m_message.m_allocContext;
#endif

	switch (destination) {
	case 0:
		break;

	case 1:
		cn = cn_cbor_mapget_int(pKey, COSE_Key_ID);
		CHECK_CONDITION(cn != NULL, COSE_ERR_INVALID_PARAMETER);
		cn2 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn2 != NULL, cbor_err);
		CHECK_CONDITION(_COSE_map_put(&p->m_encrypt.m_message, COSE_Header_ECDH_SPK_KID, cn2, COSE_UNPROTECT_ONLY, perr), perr->err);
		cn2 = NULL;
		break;

	case 2:
		cn2 = cn_cbor_map_create(CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn2 != NULL, cbor_err);
		cn = cn_cbor_mapget_int(pKey, COSE_Key_Type);
		CHECK_CONDITION(cn != NULL, COSE_ERR_INVALID_PARAMETER);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_Type, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		cn = cn_cbor_mapget_int(pKey, COSE_Key_EC2_Curve);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_EC2_Curve, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		cn = cn_cbor_mapget_int(pKey, COSE_Key_EC2_X);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_EC2_X, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		cn = cn_cbor_mapget_int(pKey, COSE_Key_EC2_Y);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_EC2_Y, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		CHECK_CONDITION(_COSE_map_put(&p->m_encrypt.m_message, COSE_Header_ECDH_SPK, cn2, COSE_UNPROTECT_ONLY, perr), perr->err);
		cn2 = NULL;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}

	p->m_pkeyStatic = pKey;

	f = true;
errorReturn:
	if (cn2 != NULL) CN_CBOR_FREE(cn2, context);
	if (cn3 != NULL) CN_CBOR_FREE(cn3, context);
	return f;
}